

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::optUsage
          (CommandLine<Catch::ConfigData> *this,ostream *os,size_t indent,size_t width)

{
  pointer *this_00;
  ulong uVar1;
  ostream *poVar2;
  ulong uVar3;
  _Alloc_hider _Var4;
  pointer this_01;
  ulong uVar5;
  pointer *this_02;
  long lVar6;
  pointer this_03;
  undefined1 local_150 [8];
  Text usage;
  Text desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type local_70;
  undefined1 local_68 [8];
  string usageCol;
  
  usageCol.field_2._8_8_ =
       (this->m_options).
       super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  _Var4._M_p = (pointer)0x0;
  this_01 = (this->m_options).
            super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (this_03 = this_01; this_03 != (pointer)usageCol.field_2._8_8_; this_03 = this_03 + 1) {
    Arg::commands_abi_cxx11_((string *)local_150,this_03);
    if (_Var4._M_p <= usage.str._M_dataplus._M_p) {
      _Var4 = usage.str._M_dataplus;
    }
    std::__cxx11::string::~string((string *)local_150);
  }
  local_90.field_2._8_8_ = _Var4._M_p + indent;
  local_70 = (width - (long)_Var4._M_p) - 3;
  local_90.field_2._M_allocated_capacity = (size_type)(_Var4._M_p + indent + 2);
  this_00 = &desc.lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (; this_02 = &usage.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
      this_01 != (pointer)usageCol.field_2._8_8_; this_01 = this_01 + 1) {
    Arg::commands_abi_cxx11_((string *)this_02,this_01);
    local_68 = (undefined1  [8])0xffffffffffffffff;
    usageCol.field_2._M_local_buf[0] = '\t';
    usageCol._M_string_length = local_90.field_2._8_8_;
    usageCol._M_dataplus._M_p = (pointer)indent;
    ::Tbc::Text::Text((Text *)local_150,(string *)this_02,(TextAttributes *)local_68);
    std::__cxx11::string::~string((string *)this_02);
    local_68 = (undefined1  [8])0xffffffffffffffff;
    usageCol._M_dataplus._M_p = (pointer)0x0;
    usageCol.field_2._M_local_buf[0] = '\t';
    usageCol._M_string_length = local_70;
    ::Tbc::Text::Text((Text *)this_02,
                      &(this_01->super_CommonArgProperties<Catch::ConfigData>).description,
                      (TextAttributes *)local_68);
    lVar6 = 0;
    uVar5 = 0;
    while( true ) {
      uVar1 = (long)usage.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - usage.attr._24_8_ >> 5;
      uVar3 = (long)desc.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - desc.attr._24_8_ >> 5;
      if (uVar3 < uVar1) {
        uVar3 = uVar1;
      }
      if (uVar3 <= uVar5) break;
      if (uVar5 < uVar1) {
        std::__cxx11::string::string((string *)local_68,(string *)(usage.attr._24_8_ + lVar6));
      }
      else {
        std::__cxx11::string::string((string *)local_68,"",(allocator *)this_00);
      }
      std::operator<<(os,(string *)local_68);
      if ((uVar5 < (ulong)((long)desc.lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start - desc.attr._24_8_ >> 5))
         && (*(long *)(desc.attr._24_8_ + 8 + lVar6) != 0)) {
        desc.lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_90;
        std::__cxx11::string::_M_construct
                  ((ulong)this_00,
                   (char)local_90.field_2._M_allocated_capacity - (char)usageCol._M_dataplus._M_p);
        poVar2 = std::operator<<(os,(string *)this_00);
        std::operator<<(poVar2,(string *)(desc.attr._24_8_ + lVar6));
        std::__cxx11::string::~string((string *)this_00);
      }
      std::operator<<(os,"\n");
      std::__cxx11::string::~string((string *)local_68);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    }
    ::Tbc::Text::~Text((Text *)&usage.lines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::Tbc::Text::~Text((Text *)local_150);
  }
  return;
}

Assistant:

void optUsage( std::ostream& os, std::size_t indent = 0, std::size_t width = Detail::consoleWidth ) const {
            typename std::vector<Arg>::const_iterator itBegin = m_options.begin(), itEnd = m_options.end(), it;
            std::size_t maxWidth = 0;
            for( it = itBegin; it != itEnd; ++it )
                maxWidth = (std::max)( maxWidth, it->commands().size() );

            for( it = itBegin; it != itEnd; ++it ) {
                Detail::Text usage( it->commands(), Detail::TextAttributes()
                                                        .setWidth( maxWidth+indent )
                                                        .setIndent( indent ) );
                Detail::Text desc( it->description, Detail::TextAttributes()
                                                        .setWidth( width - maxWidth - 3 ) );

                for( std::size_t i = 0; i < (std::max)( usage.size(), desc.size() ); ++i ) {
                    std::string usageCol = i < usage.size() ? usage[i] : "";
                    os << usageCol;

                    if( i < desc.size() && !desc[i].empty() )
                        os  << std::string( indent + 2 + maxWidth - usageCol.size(), ' ' )
                            << desc[i];
                    os << "\n";
                }
            }
        }